

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityDestinationRecord.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::EntityDestinationRecord::EntityDestinationRecord
          (EntityDestinationRecord *this,EntityIdentifier *ID,KUINT16 CommDeviceID,KUINT8 LineID,
          KUINT8 Priority,LineStateCommand LSC)

{
  LineStateCommand LSC_local;
  KUINT8 Priority_local;
  KUINT8 LineID_local;
  KUINT16 CommDeviceID_local;
  EntityIdentifier *ID_local;
  EntityDestinationRecord *this_local;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityDestinationRecord_0033aa40;
  EntityIdentifier::EntityIdentifier(&this->m_Entity,ID);
  this->m_ui16DstCommsDvcID = CommDeviceID;
  this->m_ui8DstLineID = LineID;
  this->m_ui8DstPriority = Priority;
  this->m_ui8LnStCmd = (KUINT8)LSC;
  this->m_uiPadding1 = '\0';
  return;
}

Assistant:

EntityDestinationRecord::EntityDestinationRecord( const EntityIdentifier & ID, KUINT16 CommDeviceID, KUINT8 LineID,
        KUINT8 Priority, LineStateCommand LSC ) :
    m_Entity( ID ),
    m_ui16DstCommsDvcID( CommDeviceID ),
    m_ui8DstLineID( LineID ),
    m_ui8DstPriority( Priority ),
    m_ui8LnStCmd( LSC ),
    m_uiPadding1( 0 )
{
}